

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall capnp::LocalRequest::sendStreaming(LocalRequest *this)

{
  LocalRequest *in_RSI;
  RemotePromise<capnp::AnyPointer> local_50;
  undefined1 local_19;
  bool isStreaming;
  LocalRequest *this_local;
  
  local_19 = 1;
  this_local = this;
  sendImpl(&local_50,in_RSI,true);
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::ignoreResult
            ((Promise<capnp::Response<capnp::AnyPointer>_> *)this);
  RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_50);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> sendStreaming() override {
    // We don't do any special handling of streaming in RequestHook for local requests, because
    // there is no latency to compensate for between the client and server in this case.  However,
    // we record whether the call was streaming, so that it can be preserved as a streaming call
    // if the local capability later resolves to a remote capability.
    bool isStreaming = true;
    return sendImpl(isStreaming).ignoreResult();
  }